

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceProcessor::ResetVocabulary(SentencePieceProcessor *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Status *_status;
  long *in_RSI;
  
  (**(code **)(*in_RSI + 0x38))();
  if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
    util::Status::~Status((Status *)this);
    lVar4 = *(long *)(in_RSI[4] + 0x40);
    lVar3 = lVar4 + 8;
    if (lVar4 == 0) {
      lVar3 = 0;
    }
    iVar1 = *(int *)(in_RSI[4] + 0x38);
    for (lVar4 = 0; (long)iVar1 * 8 != lVar4; lVar4 = lVar4 + 8) {
      lVar2 = *(long *)(lVar3 + lVar4);
      if (*(int *)(lVar2 + 0x3c) == 5) {
        *(byte *)(lVar2 + 0x28) = *(byte *)(lVar2 + 0x28) | 4;
        *(undefined4 *)(lVar2 + 0x3c) = 1;
      }
    }
    util::Status::Status((Status *)this);
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::ResetVocabulary() {
  RETURN_IF_ERROR(status());
  for (auto &piece : *(model_proto_->mutable_pieces())) {
    if (piece.type() == ModelProto::SentencePiece::UNUSED)
      piece.set_type(ModelProto::SentencePiece::NORMAL);
  }

  return util::OkStatus();
}